

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

uchar * base64_decode(uchar *code)

{
  size_t sVar1;
  char *pcVar2;
  uchar *puVar3;
  int local_228;
  int local_224;
  int j;
  int i;
  uchar *res;
  long str_len;
  long len;
  int table [123];
  uchar *code_local;
  
  memcpy(&len,&DAT_0010b7d0,0x1ec);
  sVar1 = strlen((char *)code);
  pcVar2 = strstr((char *)code,"==");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strstr((char *)code,"=");
    if (pcVar2 == (char *)0x0) {
      res = (uchar *)(((long)sVar1 / 4) * 3);
    }
    else {
      res = (uchar *)(((long)sVar1 / 4) * 3 + -1);
    }
  }
  else {
    res = (uchar *)(((long)sVar1 / 4) * 3 + -2);
  }
  puVar3 = (uchar *)malloc((size_t)(res + 1));
  puVar3[(long)res] = '\0';
  local_228 = 0;
  for (local_224 = 0; (long)local_224 < (long)(sVar1 - 2); local_224 = local_224 + 4) {
    puVar3[local_228] =
         (byte)((table[(ulong)code[local_224] - 2] & 0xffU) << 2) |
         (byte)((int)(table[(ulong)code[local_224 + 1] - 2] & 0xffU) >> 4);
    puVar3[local_228 + 1] =
         (byte)((table[(ulong)code[local_224 + 1] - 2] & 0xffU) << 4) |
         (byte)((int)(table[(ulong)code[local_224 + 2] - 2] & 0xffU) >> 2);
    puVar3[local_228 + 2] =
         (byte)((table[(ulong)code[local_224 + 2] - 2] & 0xffU) << 6) |
         (byte)table[(ulong)code[local_224 + 3] - 2];
    local_228 = local_228 + 3;
  }
  return puVar3;
}

Assistant:

unsigned char *base64_decode(unsigned char *code) {
//根据base64表，以字符找到对应的十进制数据
    int table[] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
                   0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
                   0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
                   0, 0, 0, 0, 0, 0, 0, 62, 0, 0, 0,
                   63, 52, 53, 54, 55, 56, 57, 58,
                   59, 60, 61, 0, 0, 0, 0, 0, 0, 0, 0,
                   1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12,
                   13, 14, 15, 16, 17, 18, 19, 20, 21,
                   22, 23, 24, 25, 0, 0, 0, 0, 0, 0, 26,
                   27, 28, 29, 30, 31, 32, 33, 34, 35,
                   36, 37, 38, 39, 40, 41, 42, 43, 44,
                   45, 46, 47, 48, 49, 50, 51
    };
    long len;
    long str_len;
    unsigned char *res;
    int i, j;

//计算解码后的字符串长度
    len = strlen(reinterpret_cast<const char *>(code));
//判断编码后的字符串后是否有=
    if (strstr(reinterpret_cast<char *>(code), "=="))
        str_len = len / 4 * 3 - 2;
    else if (strstr(reinterpret_cast<char *>(code), "="))
        str_len = len / 4 * 3 - 1;
    else
        str_len = len / 4 * 3;

    res = static_cast<unsigned char *>(malloc(sizeof(unsigned char) * str_len + 1));
    res[str_len] = '\0';

//以4个字符为一位进行解码
    for (i = 0, j = 0; i < len - 2; j += 3, i += 4) {
        res[j] = ((unsigned char) table[code[i]]) << 2 |
                 (((unsigned char) table[code[i + 1]]) >> 4); //取出第一个字符对应base64表的十进制数的前6位与第二个字符对应base64表的十进制数的后2位进行组合
        res[j + 1] = (((unsigned char) table[code[i + 1]]) << 4) | (((unsigned char) table[code[i + 2]])
                >> 2); //取出第二个字符对应base64表的十进制数的后4位与第三个字符对应bas464表的十进制数的后4位进行组合
        res[j + 2] = (((unsigned char) table[code[i + 2]]) << 6) |
                     ((unsigned char) table[code[i + 3]]); //取出第三个字符对应base64表的十进制数的后2位与第4个字符进行组合
    }

    return res;

}